

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.h
# Opt level: O3

void __thiscall
slang::parsing::ParserMetadata::ParserMetadata(ParserMetadata *this,ParserMetadata *param_1)

{
  Info *pIVar1;
  bool bVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>
  local_2a;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_29;
  
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
  ::table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                *)this,(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                        *)param_1,&local_2a);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&this->globalInstances,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&param_1->globalInstances,&local_29);
  std::
  vector<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ::vector(&this->classPackageNames,&param_1->classPackageNames);
  std::
  vector<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ::vector(&this->packageImports,&param_1->packageImports);
  std::
  vector<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ::vector(&this->classDecls,&param_1->classDecls);
  std::
  vector<const_slang::syntax::InterfacePortHeaderSyntax_*,_std::allocator<const_slang::syntax::InterfacePortHeaderSyntax_*>_>
  ::vector(&this->interfacePorts,&param_1->interfacePorts);
  bVar2 = param_1->hasBindDirectives;
  this->hasDefparams = param_1->hasDefparams;
  this->hasBindDirectives = bVar2;
  uVar3 = (param_1->eofToken).field_0x2;
  NVar4.raw = (param_1->eofToken).numFlags.raw;
  uVar5 = (param_1->eofToken).rawLen;
  pIVar1 = (param_1->eofToken).info;
  (this->eofToken).kind = (param_1->eofToken).kind;
  (this->eofToken).field_0x2 = uVar3;
  (this->eofToken).numFlags = (NumericTokenFlags)NVar4.raw;
  (this->eofToken).rawLen = uVar5;
  (this->eofToken).info = pIVar1;
  return;
}

Assistant:

struct SLANG_EXPORT ParserMetadata {
    /// Collection of metadata that can be associated with a syntax node at parse time.
    struct Node {
        TokenKind defaultNetType;
        TokenKind unconnectedDrive;
        bool cellDefine = false;
        std::optional<TimeScale> timeScale;
    };

    /// Specific metadata that was in effect when certain syntax nodes were parsed
    /// (such as various bits of preprocessor state).
    flat_hash_map<const syntax::SyntaxNode*, Node> nodeMap;

    /// A set of names of all instantiations of global modules/interfaces/programs.
    /// This can be used to determine which modules should be considered as top-level
    /// roots of the design.
    flat_hash_set<std::string_view> globalInstances;

    /// A list of all names parsed that could represent a package or class name,
    /// since they are simple names that appear on the left-hand side of a double colon.
    std::vector<const syntax::IdentifierNameSyntax*> classPackageNames;

    /// A list of all package import declarations parsed.
    std::vector<const syntax::PackageImportDeclarationSyntax*> packageImports;

    /// A list of all class declarations parsed.
    std::vector<const syntax::ClassDeclarationSyntax*> classDecls;

    /// A list of all interface port headers parsed.
    std::vector<const syntax::InterfacePortHeaderSyntax*> interfacePorts;

    /// The EOF token, if one has already been consumed by the parser.
    /// Otherwise an empty token.
    Token eofToken;

    /// Indicates whether the parse tree has any defparam directives.
    bool hasDefparams = false;

    /// Indicates whether the parse tree has any bind directives.
    bool hasBindDirectives = false;

    /// Constructs a new set of parser metadata by walking the provided syntax tree.
    static ParserMetadata fromSyntax(const syntax::SyntaxNode& root);
}